

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

bool __thiscall
google::protobuf::DescriptorPool::IsSubSymbolOfBuiltType(DescriptorPool *this,string *name)

{
  pointer pcVar1;
  Tables *pTVar2;
  _Node **pp_Var3;
  ulong uVar4;
  long *__s1;
  bool bVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  _Node *p_Var9;
  Symbol *pSVar10;
  char cVar11;
  _Node *p_Var12;
  long *plVar13;
  string prefix;
  long *local_78 [2];
  long local_68 [2];
  string *local_58;
  long *local_50 [2];
  long local_40 [2];
  
  local_78[0] = local_68;
  pcVar1 = (name->_M_dataplus)._M_p;
  local_58 = name;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_78,pcVar1,pcVar1 + name->_M_string_length);
  lVar7 = std::__cxx11::string::rfind((char)(string *)local_78,0x2e);
  if (lVar7 != -1) {
    do {
      std::__cxx11::string::substr((ulong)local_50,(ulong)local_78);
      std::__cxx11::string::operator=((string *)local_78,(string *)local_50);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      __s1 = local_78[0];
      pTVar2 = (this->tables_).ptr_;
      if (pTVar2 == (Tables *)0x0) {
        __assert_fail("ptr_ != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/stubs/common.h"
                      ,0x1e2,
                      "C *google::protobuf::internal::scoped_ptr<google::protobuf::DescriptorPool::Tables>::operator->() const [C = google::protobuf::DescriptorPool::Tables]"
                     );
      }
      cVar11 = (char)*local_78[0];
      if (cVar11 == '\0') {
        uVar8 = 0;
      }
      else {
        uVar8 = 0;
        plVar13 = local_78[0];
        do {
          plVar13 = (long *)((long)plVar13 + 1);
          uVar8 = (long)cVar11 + uVar8 * 5;
          cVar11 = *(char *)plVar13;
        } while (cVar11 != '\0');
      }
      pp_Var3 = (pTVar2->symbols_by_name_).
                super_unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>_>
                .
                super___unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_false>
                .
                super__Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
                ._M_buckets;
      uVar4 = (pTVar2->symbols_by_name_).
              super_unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>_>
              .
              super___unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_false>
              .
              super__Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
              ._M_bucket_count;
      for (p_Var12 = pp_Var3[uVar8 % uVar4]; p_Var12 != (_Node *)0x0; p_Var12 = p_Var12->_M_next) {
        iVar6 = strcmp((char *)__s1,(p_Var12->_M_v).first);
        if (iVar6 == 0) {
          p_Var9 = pp_Var3[uVar4];
          goto LAB_001cc1d4;
        }
      }
      p_Var9 = pp_Var3[uVar4];
      p_Var12 = p_Var9;
LAB_001cc1d4:
      pSVar10 = &(p_Var12->_M_v).second;
      if (p_Var12 == p_Var9) {
        pSVar10 = (Symbol *)&(anonymous_namespace)::kNullSymbol;
      }
      if ((pSVar10->type != NULL_SYMBOL) && (pSVar10->type != PACKAGE)) {
        bVar5 = true;
        goto LAB_001cc231;
      }
      lVar7 = std::__cxx11::string::rfind((char)(string *)local_78,0x2e);
    } while (lVar7 != -1);
  }
  if (this->underlay_ == (DescriptorPool *)0x0) {
    bVar5 = false;
  }
  else {
    bVar5 = IsSubSymbolOfBuiltType(this->underlay_,local_58);
  }
LAB_001cc231:
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  return bVar5;
}

Assistant:

bool DescriptorPool::IsSubSymbolOfBuiltType(const string& name) const {
  string prefix = name;
  for (;;) {
    string::size_type dot_pos = prefix.find_last_of('.');
    if (dot_pos == string::npos) {
      break;
    }
    prefix = prefix.substr(0, dot_pos);
    Symbol symbol = tables_->FindSymbol(prefix);
    // If the symbol type is anything other than PACKAGE, then its complete
    // definition is already known.
    if (!symbol.IsNull() && symbol.type != Symbol::PACKAGE) {
      return true;
    }
  }
  if (underlay_ != NULL) {
    // Check to see if any prefix of this symbol exists in the underlay.
    return underlay_->IsSubSymbolOfBuiltType(name);
  }
  return false;
}